

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

void __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::LogDecommitPages(PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                   *this,size_t pageCount)

{
  PageMemoryData *pPVar1;
  
  this->committedBytes = this->committedBytes + pageCount * -0x1000;
  pPVar1 = this->memoryData;
  if (pPVar1 != (PageMemoryData *)0x0) {
    pPVar1->decommitPageCount = pPVar1->decommitPageCount + pageCount;
    pPVar1->currentCommittedPageCount = pPVar1->currentCommittedPageCount - pageCount;
  }
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::LogDecommitPages(size_t pageCount)
{
    SubCommittedBytes(pageCount * AutoSystemInfo::PageSize);
#ifdef PROFILE_MEM
    if (this->memoryData)
    {
        this->memoryData->decommitPageCount += pageCount;
        this->memoryData->currentCommittedPageCount -= pageCount;
    }
#endif
}